

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O0

void duckdb::UnaryExecutor::
     ExecuteStandard<duckdb::string_t,int,duckdb::UnaryOperatorWrapper,duckdb::AsciiOperator>
               (Vector *input,Vector *result,idx_t count,void *dataptr,bool adds_nulls,
               FunctionErrors errors)

{
  string_t input_00;
  VectorType VVar1;
  bool bVar2;
  int iVar3;
  ValidityMask *result_mask;
  ValidityMask *result_data_00;
  idx_t iVar4;
  string_t *this;
  SelectionVector *pSVar5;
  ValidityMask *pVVar6;
  UnifiedVectorFormat *in_RDX;
  Vector *in_RSI;
  Vector *in_RDI;
  undefined4 in_R8D;
  char in_R9B;
  uint uVar7;
  string_t *ldata_3;
  int *result_data_3;
  UnifiedVectorFormat vdata;
  SelectionVector *offsets;
  string_t *ldata_2;
  int *result_data_2;
  Vector *dictionary_values;
  optional_idx dict_size;
  string_t *ldata_1;
  int *result_data_1;
  string_t *ldata;
  int *result_data;
  Vector *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined8 in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  UnifiedVectorFormat *this_00;
  ValidityMask *in_stack_fffffffffffffea0;
  SelectionVector *in_stack_fffffffffffffea8;
  idx_t in_stack_fffffffffffffeb0;
  int *in_stack_fffffffffffffeb8;
  string_t *in_stack_fffffffffffffec0;
  undefined1 uVar8;
  void *in_stack_fffffffffffffec8;
  Vector *pVVar9;
  ValidityMask *in_stack_fffffffffffffed0;
  ValidityMask *in_stack_fffffffffffffed8;
  idx_t in_stack_fffffffffffffee0;
  int *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  UnifiedVectorFormat local_c8 [72];
  SelectionVector *local_80;
  string_t *local_78;
  int *local_70;
  Vector *local_68;
  optional_idx local_60;
  ValidityMask *local_58;
  ValidityMask *local_50;
  undefined8 local_48;
  char *local_40;
  string_t *local_38;
  int *local_30;
  char local_22;
  byte local_21;
  UnifiedVectorFormat *local_18;
  Vector *local_10;
  Vector *local_8;
  
  local_21 = (byte)in_R8D & 1;
  local_22 = in_R9B;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == FLAT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    uVar8 = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
    local_50 = (ValidityMask *)FlatVector::GetData<int>((Vector *)0xf15ca6);
    result_mask = (ValidityMask *)FlatVector::GetData<duckdb::string_t>((Vector *)0xf15cbb);
    pVVar6 = local_50;
    local_58 = result_mask;
    result_data_00 = FlatVector::Validity((Vector *)0xf15cfd);
    FlatVector::Validity((Vector *)0xf15d12);
    ExecuteFlat<duckdb::string_t,int,duckdb::UnaryOperatorWrapper,duckdb::AsciiOperator>
              ((string_t *)CONCAT44(in_R8D,in_stack_fffffffffffffef0),(int *)result_data_00,
               (idx_t)local_18,pVVar6,result_mask,in_stack_fffffffffffffec8,(bool)uVar8);
  }
  else if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_10);
    local_30 = ConstantVector::GetData<int>((Vector *)0xf15bd6);
    local_38 = ConstantVector::GetData<duckdb::string_t>((Vector *)0xf15beb);
    bVar2 = ConstantVector::IsNull((Vector *)0xf15c00);
    if (bVar2) {
      duckdb::ConstantVector::SetNull(local_10,true);
    }
    else {
      duckdb::ConstantVector::SetNull(local_10,false);
      local_48 = *(undefined8 *)&local_38->value;
      local_40 = (local_38->value).pointer.ptr;
      ConstantVector::Validity(local_10);
      input_00.value.pointer.ptr = (char *)in_stack_fffffffffffffe70;
      input_00.value._0_8_ = in_stack_fffffffffffffe68;
      iVar3 = UnaryOperatorWrapper::Operation<duckdb::AsciiOperator,duckdb::string_t,int>
                        (input_00,(ValidityMask *)
                                  CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                         (idx_t)in_stack_fffffffffffffe58,(void *)0xf15c79);
      *local_30 = iVar3;
    }
  }
  else {
    if ((VVar1 == DICTIONARY_VECTOR) && (local_22 == '\0')) {
      local_60 = DictionaryVector::DictionarySize(in_stack_fffffffffffffe58);
      bVar2 = optional_idx::IsValid(&local_60);
      if ((bVar2) &&
         (iVar4 = optional_idx::GetIndex((optional_idx *)in_stack_fffffffffffffea0),
         (UnifiedVectorFormat *)(iVar4 * 2) < local_18 || (long)(iVar4 * 2) - (long)local_18 == 0))
      {
        local_68 = DictionaryVector::Child((Vector *)0xf15db7);
        VVar1 = Vector::GetVectorType(local_68);
        if (VVar1 == FLAT_VECTOR) {
          local_70 = FlatVector::GetData<int>((Vector *)0xf15de1);
          uVar8 = (undefined1)((ulong)in_stack_fffffffffffffec0 >> 0x38);
          this = FlatVector::GetData<duckdb::string_t>((Vector *)0xf15df6);
          local_78 = this;
          optional_idx::GetIndex((optional_idx *)this);
          FlatVector::Validity((Vector *)0xf15e37);
          FlatVector::Validity((Vector *)0xf15e49);
          ExecuteFlat<duckdb::string_t,int,duckdb::UnaryOperatorWrapper,duckdb::AsciiOperator>
                    ((string_t *)CONCAT44(in_R8D,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                     in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,(bool)uVar8);
          local_80 = DictionaryVector::SelVector((Vector *)0xf15e89);
          pVVar9 = local_10;
          pSVar5 = (SelectionVector *)optional_idx::GetIndex((optional_idx *)this);
          duckdb::Vector::Dictionary(local_10,(ulong)pVVar9,pSVar5,(ulong)local_80);
          return;
        }
      }
    }
    this_00 = local_c8;
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(this_00);
    duckdb::Vector::ToUnifiedFormat((ulong)local_8,local_18);
    duckdb::Vector::SetVectorType((VectorType)local_10);
    FlatVector::GetData<int>((Vector *)0xf15f31);
    UnifiedVectorFormat::GetData<duckdb::string_t>(local_c8);
    pVVar6 = FlatVector::Validity((Vector *)0xf15f9c);
    uVar7 = local_21 & 1;
    ExecuteLoop<duckdb::string_t,int,duckdb::UnaryOperatorWrapper,duckdb::AsciiOperator>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,(ValidityMask *)this_00,
               in_stack_fffffffffffffed0,SUB81((ulong)pVVar6 >> 0x38,0));
    UnifiedVectorFormat::~UnifiedVectorFormat
              ((UnifiedVectorFormat *)CONCAT44(in_stack_fffffffffffffe64,uVar7));
  }
  return;
}

Assistant:

static inline void ExecuteStandard(Vector &input, Vector &result, idx_t count, void *dataptr, bool adds_nulls,
	                                   FunctionErrors errors = FunctionErrors::CAN_THROW_RUNTIME_ERROR) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);
			auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);
			auto ldata = ConstantVector::GetData<INPUT_TYPE>(input);

			if (ConstantVector::IsNull(input)) {
				ConstantVector::SetNull(result, true);
			} else {
				ConstantVector::SetNull(result, false);
				*result_data = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
				    *ldata, ConstantVector::Validity(result), 0, dataptr);
			}
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = FlatVector::GetData<INPUT_TYPE>(input);

			ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, FlatVector::Validity(input),
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		case VectorType::DICTIONARY_VECTOR: {
			// dictionary vector - we can run the function ONLY on the dictionary in some cases
			// we can only do this if the function does not throw errors
			// we can execute the function on a value that is in the dictionary but that is not referenced
			// if the function can throw errors - this will result in us (incorrectly) throwing an error
			if (errors == FunctionErrors::CANNOT_ERROR) {
				static constexpr idx_t DICTIONARY_THRESHOLD = 2;
				auto dict_size = DictionaryVector::DictionarySize(input);
				if (dict_size.IsValid() && dict_size.GetIndex() * DICTIONARY_THRESHOLD <= count) {
					// we can operate directly on the dictionary if we have a dictionary size
					// but this only makes sense if the dictionary size is smaller than the count by some factor
					auto &dictionary_values = DictionaryVector::Child(input);
					if (dictionary_values.GetVectorType() == VectorType::FLAT_VECTOR) {
						// execute the function over the dictionary
						auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
						auto ldata = FlatVector::GetData<INPUT_TYPE>(dictionary_values);
						ExecuteFlat<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(
						    ldata, result_data, dict_size.GetIndex(), FlatVector::Validity(dictionary_values),
						    FlatVector::Validity(result), dataptr, adds_nulls);
						// slice the result with the original offsets
						auto &offsets = DictionaryVector::SelVector(input);
						result.Dictionary(result, dict_size.GetIndex(), offsets, count);
						break;
					}
				}
			}
			DUCKDB_EXPLICIT_FALLTHROUGH;
		}
#endif
		default: {
			UnifiedVectorFormat vdata;
			input.ToUnifiedFormat(count, vdata);

			result.SetVectorType(VectorType::FLAT_VECTOR);
			auto result_data = FlatVector::GetData<RESULT_TYPE>(result);
			auto ldata = UnifiedVectorFormat::GetData<INPUT_TYPE>(vdata);

			ExecuteLoop<INPUT_TYPE, RESULT_TYPE, OPWRAPPER, OP>(ldata, result_data, count, vdata.sel, vdata.validity,
			                                                    FlatVector::Validity(result), dataptr, adds_nulls);
			break;
		}
		}
	}